

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O2

void roguejoin(level *lev,int x1,int y1,int x2,int y2,int horiz)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  schar *psVar5;
  
  if (horiz == 0) {
    iVar1 = rn2((y2 - y1) + 1);
    iVar1 = iVar1 + y1;
    lVar3 = (long)x1;
    lVar4 = (long)y1;
    psVar5 = &lev->locations[lVar3][lVar4].typ;
    for (; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
      *psVar5 = '\x18';
      psVar5 = psVar5 + 0xc;
    }
    if (x1 <= x2) {
      x1 = x2;
    }
    lVar4 = (long)x2;
    if (lVar4 < lVar3) {
      lVar3 = lVar4;
    }
    psVar5 = &lev->locations[lVar3][iVar1].typ;
    for (; lVar3 <= x1; lVar3 = lVar3 + 1) {
      *psVar5 = '\x18';
      psVar5 = psVar5 + 0xfc;
    }
    iVar2 = iVar1;
    if (y2 < iVar1) {
      iVar2 = y2;
      y2 = iVar1;
    }
    lVar3 = (long)iVar2;
    psVar5 = &lev->locations[lVar4][lVar3].typ;
    for (; lVar3 <= y2; lVar3 = lVar3 + 1) {
      *psVar5 = '\x18';
      psVar5 = psVar5 + 0xc;
    }
  }
  else {
    iVar1 = rn2((x2 - x1) + 1);
    iVar1 = iVar1 + x1;
    lVar3 = (long)y1;
    lVar4 = (long)x1;
    psVar5 = &lev->locations[lVar4][lVar3].typ;
    for (; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
      *psVar5 = '\x18';
      psVar5 = psVar5 + 0xfc;
    }
    if (y1 <= y2) {
      y1 = y2;
    }
    lVar4 = (long)y2;
    if (lVar4 < lVar3) {
      lVar3 = lVar4;
    }
    psVar5 = &lev->locations[iVar1][lVar3].typ;
    for (; lVar3 <= y1; lVar3 = lVar3 + 1) {
      *psVar5 = '\x18';
      psVar5 = psVar5 + 0xc;
    }
    iVar2 = iVar1;
    if (x2 < iVar1) {
      iVar2 = x2;
      x2 = iVar1;
    }
    lVar3 = (long)iVar2;
    psVar5 = &lev->locations[lVar3][lVar4].typ;
    for (; lVar3 <= x2; lVar3 = lVar3 + 1) {
      *psVar5 = '\x18';
      psVar5 = psVar5 + 0xfc;
    }
  }
  return;
}

Assistant:

static void roguejoin(struct level *lev, int x1, int y1, int x2, int y2, int horiz)
{
	int x,y,middle;
#ifndef MAX
#define MAX(a,b) (((a) > (b)) ? (a) : (b))
#endif
#ifndef MIN
#define MIN(a,b) (((a) < (b)) ? (a) : (b))
#endif
	if (horiz) {
		middle = x1 + rn2(x2-x1+1);
		for (x=MIN(x1,middle); x<=MAX(x1,middle); x++)
			corr(lev, x, y1);
		for (y=MIN(y1,y2); y<=MAX(y1,y2); y++)
			corr(lev, middle,y);
		for (x=MIN(middle,x2); x<=MAX(middle,x2); x++)
			corr(lev, x, y2);
	} else {
		middle = y1 + rn2(y2-y1+1);
		for (y=MIN(y1,middle); y<=MAX(y1,middle); y++)
			corr(lev, x1, y);
		for (x=MIN(x1,x2); x<=MAX(x1,x2); x++)
			corr(lev, x, middle);
		for (y=MIN(middle,y2); y<=MAX(middle,y2); y++)
			corr(lev, x2,y);
	}
}